

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cpp
# Opt level: O2

void D4C(double *x,int x_length,int fs,double *temporal_positions,double *f0,int f0_length,
        int fft_size,D4COption *option,double **aperiodicity)

{
  int iVar1;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  int i;
  int iVar2;
  int iVar3;
  double *y;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  double *pdVar7;
  double *x_00;
  double *xi;
  ulong uVar8;
  double *pdVar9;
  double *input;
  double *input_00;
  double *pdVar10;
  double *centroid;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint xi_length;
  ulong uVar19;
  ulong uVar20;
  fft_plan *pfVar21;
  uint fft_size_00;
  undefined8 *puVar22;
  int i_9;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  byte bVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  double dVar36;
  undefined8 in_stack_fffffffffffffd88;
  RandnState *randn_state_00;
  undefined1 in_stack_fffffffffffffd90 [64];
  double dStack_200;
  RandnState randn_state;
  ForwardRealFFT forward_real_fft;
  ForwardRealFFT local_98;
  
  bVar27 = 0;
  randn_state.g_randn_x = 0;
  randn_state.g_randn_y = 0;
  randn_state.g_randn_z = 0;
  randn_state.g_randn_w = 0;
  randn_reseed(&randn_state);
  iVar2 = fft_size / 2;
  iVar1 = -1;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  uVar12 = 0;
  uVar25 = 0;
  if (0 < f0_length) {
    uVar25 = (ulong)(uint)f0_length;
  }
  for (; uVar12 != uVar25; uVar12 = uVar12 + 1) {
    for (uVar19 = 0; iVar1 + 1 != uVar19; uVar19 = uVar19 + 1) {
      aperiodicity[uVar12][uVar19] = 0.999999999999;
    }
  }
  dVar34 = (double)fs;
  dVar28 = log((dVar34 * 4.0) / 47.0 + 1.0);
  dVar29 = exp2((double)(int)(dVar28 / 0.6931471805599453) + 1.0);
  fft_size_00 = (uint)dVar29;
  forward_real_fft.forward_fft.ip = (int *)0x0;
  forward_real_fft.forward_fft.w = (double *)0x0;
  forward_real_fft.forward_fft.out = (double *)0x0;
  forward_real_fft.forward_fft.input = (double *)0x0;
  forward_real_fft.forward_fft.in = (double *)0x0;
  forward_real_fft.forward_fft.c_out = (fft_complex *)0x0;
  forward_real_fft.forward_fft.flags = 0;
  forward_real_fft.forward_fft._12_4_ = 0;
  forward_real_fft.forward_fft.c_in = (fft_complex *)0x0;
  forward_real_fft.spectrum = (fft_complex *)0x0;
  forward_real_fft.forward_fft.n = 0;
  forward_real_fft.forward_fft.sign = 0;
  forward_real_fft.fft_size = 0;
  forward_real_fft._4_4_ = 0;
  forward_real_fft.waveform = (double *)0x0;
  InitializeForwardRealFFT(fft_size_00,&forward_real_fft);
  dVar30 = dVar34 * 0.5 + -3000.0;
  dVar28 = 15000.0;
  if (dVar30 <= 15000.0) {
    dVar28 = dVar30;
  }
  dVar29 = (double)(int)dVar29;
  iVar3 = (int)((dVar29 * 3000.0) / dVar34);
  iVar1 = iVar3 * 2 + 1;
  uVar12 = 0xffffffffffffffff;
  uVar19 = (long)iVar1 * 8;
  if (iVar3 < 0) {
    uVar19 = uVar12;
  }
  y = (double *)operator_new__(uVar19);
  NuttallWindow(iVar1,y);
  uVar19 = (ulong)(uint)f0_length << 3;
  if (f0_length < 0) {
    uVar19 = uVar12;
  }
  pvVar4 = operator_new__(uVar19);
  dVar30 = log((dVar34 * 3.0) / 40.0 + 1.0);
  dVar30 = exp2((double)(int)(dVar30 / 0.6931471805599453) + 1.0);
  uVar18 = (uint)dVar30;
  local_98.forward_fft.ip = (int *)0x0;
  local_98.forward_fft.w = (double *)0x0;
  local_98.forward_fft.out = (double *)0x0;
  local_98.forward_fft.input = (double *)0x0;
  local_98.forward_fft.in = (double *)0x0;
  local_98.forward_fft.c_out = (fft_complex *)0x0;
  local_98.forward_fft.flags = 0;
  local_98.forward_fft._12_4_ = 0;
  local_98.forward_fft.c_in = (fft_complex *)0x0;
  local_98.spectrum = (fft_complex *)0x0;
  local_98.forward_fft.n = 0;
  local_98.forward_fft.sign = 0;
  local_98.fft_size = 0;
  local_98._4_4_ = 0;
  local_98.waveform = (double *)0x0;
  InitializeForwardRealFFT(uVar18,&local_98);
  dVar35 = (double)(int)dVar30;
  dVar30 = ceil((dVar35 * 100.0) / dVar34);
  auVar32._0_8_ = dVar35 * 4000.0;
  auVar32._8_8_ = dVar35 * 7900.0;
  auVar33._8_8_ = dVar34;
  auVar33._0_8_ = dVar34;
  auVar33 = divpd(auVar32,auVar33);
  dVar35 = ceil(auVar33._0_8_);
  dStack_200 = auVar33._8_8_;
  dVar31 = ceil(dStack_200);
  uVar19 = (ulong)uVar18 * 8;
  if ((int)uVar18 < 0) {
    uVar19 = uVar12;
  }
  uVar20 = (ulong)(int)dVar30;
  if (-1 < (long)uVar20) {
    uVar12 = uVar20;
  }
  for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
    dVar30 = f0[uVar14];
    dVar36 = 0.0;
    if ((dVar30 != 0.0) || (NAN(dVar30))) {
      if (dVar30 <= 40.0) {
        dVar30 = 40.0;
      }
      dVar36 = temporal_positions[uVar14];
      pvVar5 = operator_new__(uVar19);
      iVar3 = matlab_round((dVar34 * 1.5) / dVar30);
      anon_unknown.dwarf_7074::GetWindowedWaveform
                (x,x_length,fs,dVar30,dVar36,2,3.0,local_98.waveform,&randn_state);
      for (lVar6 = (long)(iVar3 * 2 + 1); lVar6 < (int)uVar18; lVar6 = lVar6 + 1) {
        local_98.waveform[lVar6] = 0.0;
      }
      pfVar21 = &local_98.forward_fft;
      puVar22 = (undefined8 *)&stack0xfffffffffffffd88;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar22 = *(undefined8 *)pfVar21;
        pfVar21 = (fft_plan *)((long)pfVar21 + ((ulong)bVar27 * -2 + 1) * 8);
        puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
      }
      p.flags = in_stack_fffffffffffffd90._0_4_;
      p._12_4_ = in_stack_fffffffffffffd90._4_4_;
      p.c_in = (fft_complex *)in_stack_fffffffffffffd90._8_8_;
      p.in = (double *)in_stack_fffffffffffffd90._16_8_;
      p.c_out = (fft_complex *)in_stack_fffffffffffffd90._24_8_;
      p.out = (double *)in_stack_fffffffffffffd90._32_8_;
      p.input = (double *)in_stack_fffffffffffffd90._40_8_;
      p.ip = (int *)in_stack_fffffffffffffd90._48_8_;
      p.w = (double *)in_stack_fffffffffffffd90._56_8_;
      p.n = (int)in_stack_fffffffffffffd88;
      p.sign = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
      fft_execute(p);
      for (lVar6 = 0; uVar12 + 1 != lVar6; lVar6 = lVar6 + 1) {
        *(undefined8 *)((long)pvVar5 + lVar6 * 8) = 0;
      }
      pdVar7 = local_98.spectrum[uVar20 + 1] + 1;
      for (uVar13 = uVar20; uVar16 = uVar20, (long)uVar13 < (long)((int)uVar18 / 2);
          uVar13 = uVar13 + 1) {
        *(double *)((long)pvVar5 + uVar13 * 8 + 8) =
             (*(fft_complex *)(pdVar7 + -1))[0] * (*(fft_complex *)(pdVar7 + -1))[0] +
             *pdVar7 * *pdVar7;
        pdVar7 = pdVar7 + 2;
      }
      for (; (long)uVar16 <= (long)(int)dVar31; uVar16 = uVar16 + 1) {
        *(double *)((long)pvVar5 + uVar16 * 8) =
             *(double *)((long)pvVar5 + uVar16 * 8 + -8) + *(double *)((long)pvVar5 + uVar16 * 8);
      }
      dVar36 = *(double *)((long)pvVar5 + (long)(int)dVar35 * 8) /
               *(double *)((long)pvVar5 + (long)(int)dVar31 * 8);
      operator_delete__(pvVar5);
    }
    *(double *)((long)pvVar4 + uVar14 * 8) = dVar36;
  }
  uVar18 = (uint)(dVar28 / 3000.0);
  DestroyForwardRealFFT(&local_98);
  lVar6 = (long)(int)uVar18;
  uVar12 = lVar6 * 8 + 0x10;
  if ((int)uVar18 < -2) {
    uVar12 = 0xffffffffffffffff;
  }
  pdVar7 = (double *)operator_new__(uVar12);
  *pdVar7 = -60.0;
  pdVar7[lVar6 + 1] = -1e-12;
  x_00 = (double *)operator_new__(uVar12);
  for (lVar15 = 0; lVar15 <= lVar6; lVar15 = lVar15 + 1) {
    x_00[lVar15] = (double)(int)lVar15 * 3000.0;
  }
  x_00[lVar6 + 1] = dVar34 * 0.5;
  xi_length = iVar2 + 1;
  uVar12 = (long)iVar2 * 8 + 8;
  if (fft_size < -3) {
    uVar12 = 0xffffffffffffffff;
  }
  xi = (double *)operator_new__(uVar12);
  uVar12 = 0;
  uVar19 = 0;
  if (0 < (int)xi_length) {
    uVar19 = (ulong)xi_length;
  }
  for (; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    xi[uVar12] = ((double)(int)uVar12 * dVar34) / (double)fft_size;
  }
  iVar2 = (int)fft_size_00 / 2;
  uVar20 = (ulong)iVar2;
  uVar12 = uVar20 * 8 + 8;
  if ((int)fft_size_00 < -3) {
    uVar12 = 0xffffffffffffffff;
  }
  uVar13 = 0;
  uVar14 = (ulong)(iVar2 + 1U);
  if ((int)(iVar2 + 1U) < 1) {
    uVar14 = uVar13;
  }
  uVar16 = 0;
  if (0 < (int)fft_size_00) {
    uVar16 = (ulong)fft_size_00;
  }
  uVar8 = 0xffffffffffffffff;
  if (-1 < (long)uVar20) {
    uVar8 = uVar20;
  }
  uVar23 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar23 = uVar13;
  }
  uVar24 = (iVar1 / 2) * 2 + 1;
  uVar26 = (ulong)uVar24;
  if ((int)uVar24 < 1) {
    uVar26 = uVar13;
  }
  for (; uVar13 != uVar25; uVar13 = uVar13 + 1) {
    dVar28 = f0[uVar13];
    if (((dVar28 != 0.0) || (NAN(dVar28))) &&
       (option->threshold < *(double *)((long)pvVar4 + uVar13 * 8))) {
      dVar30 = 47.0;
      if (47.0 <= dVar28) {
        dVar30 = dVar28;
      }
      dVar28 = temporal_positions[uVar13];
      pdVar9 = (double *)operator_new__(uVar12);
      input = (double *)operator_new__(uVar12);
      input_00 = (double *)operator_new__(uVar12);
      pdVar10 = (double *)operator_new__(uVar12);
      centroid = (double *)operator_new__(uVar12);
      anon_unknown.dwarf_7074::GetCentroid
                (x,x_length,fs,dVar30,fft_size_00,dVar28 - 0.25 / dVar30,&forward_real_fft,pdVar10,
                 &randn_state);
      randn_state_00 = &randn_state;
      anon_unknown.dwarf_7074::GetCentroid
                (x,x_length,fs,dVar30,fft_size_00,0.25 / dVar30 + dVar28,&forward_real_fft,centroid,
                 randn_state_00);
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        pdVar9[uVar11] = pdVar10[uVar11] + centroid[uVar11];
      }
      DCCorrection(pdVar9,dVar30,fs,fft_size_00,pdVar9);
      operator_delete__(pdVar10);
      operator_delete__(centroid);
      for (uVar11 = 0; uVar16 != uVar11; uVar11 = uVar11 + 1) {
        forward_real_fft.waveform[uVar11] = 0.0;
      }
      anon_unknown.dwarf_7074::GetWindowedWaveform
                (x,x_length,fs,dVar30,dVar28,1,4.0,forward_real_fft.waveform,&randn_state);
      pfVar21 = &forward_real_fft.forward_fft;
      puVar22 = (undefined8 *)&stack0xfffffffffffffd88;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar22 = *(undefined8 *)pfVar21;
        pfVar21 = (fft_plan *)((long)pfVar21 + (ulong)bVar27 * -0x10 + 8);
        puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
      }
      p_00.flags = in_stack_fffffffffffffd90._0_4_;
      p_00._12_4_ = in_stack_fffffffffffffd90._4_4_;
      p_00.c_in = (fft_complex *)in_stack_fffffffffffffd90._8_8_;
      p_00.in = (double *)in_stack_fffffffffffffd90._16_8_;
      p_00.c_out = (fft_complex *)in_stack_fffffffffffffd90._24_8_;
      p_00.out = (double *)in_stack_fffffffffffffd90._32_8_;
      p_00.input = (double *)in_stack_fffffffffffffd90._40_8_;
      p_00.ip = (int *)in_stack_fffffffffffffd90._48_8_;
      p_00.w = (double *)in_stack_fffffffffffffd90._56_8_;
      p_00._0_8_ = randn_state_00;
      fft_execute(p_00);
      pdVar10 = *forward_real_fft.spectrum + 1;
      for (lVar6 = 0; uVar8 + 1 != lVar6; lVar6 = lVar6 + 1) {
        input[lVar6] = (*(fft_complex *)(pdVar10 + -1))[0] * (*(fft_complex *)(pdVar10 + -1))[0] +
                       *pdVar10 * *pdVar10;
        pdVar10 = pdVar10 + 2;
      }
      DCCorrection(input,dVar30,fs,fft_size_00,input);
      LinearSmoothing(input,dVar30,fs,fft_size_00,input);
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        input_00[uVar11] = pdVar9[uVar11] / input[uVar11];
      }
      LinearSmoothing(input_00,dVar30 * 0.5,fs,fft_size_00,input_00);
      pdVar10 = (double *)operator_new__(uVar12);
      LinearSmoothing(input_00,dVar30,fs,fft_size_00,pdVar10);
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        input_00[uVar11] = input_00[uVar11] - pdVar10[uVar11];
      }
      operator_delete__(pdVar10);
      uVar24 = matlab_round((dVar29 * 8.0) / (double)iVar1);
      for (uVar11 = 0; uVar16 != uVar11; uVar11 = uVar11 + 1) {
        forward_real_fft.waveform[uVar11] = 0.0;
      }
      pvVar5 = operator_new__(uVar12);
      uVar11 = 0;
      while (uVar11 != uVar23) {
        for (uVar17 = 0; uVar26 != uVar17; uVar17 = uVar17 + 1) {
          forward_real_fft.waveform[uVar17] =
               input_00[(long)((int)(((double)(int)(uVar11 + 1) * 3000.0 * dVar29) / dVar34) -
                              iVar1 / 2) + uVar17] * y[uVar17];
        }
        pfVar21 = &forward_real_fft.forward_fft;
        puVar22 = (undefined8 *)&stack0xfffffffffffffd88;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar22 = *(undefined8 *)pfVar21;
          pfVar21 = (fft_plan *)((long)pfVar21 + (ulong)bVar27 * -0x10 + 8);
          puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
        }
        p_01.flags = in_stack_fffffffffffffd90._0_4_;
        p_01._12_4_ = in_stack_fffffffffffffd90._4_4_;
        p_01.c_in = (fft_complex *)in_stack_fffffffffffffd90._8_8_;
        p_01.in = (double *)in_stack_fffffffffffffd90._16_8_;
        p_01.c_out = (fft_complex *)in_stack_fffffffffffffd90._24_8_;
        p_01.out = (double *)in_stack_fffffffffffffd90._32_8_;
        p_01.input = (double *)in_stack_fffffffffffffd90._40_8_;
        p_01.ip = (int *)in_stack_fffffffffffffd90._48_8_;
        p_01.w = (double *)in_stack_fffffffffffffd90._56_8_;
        p_01._0_8_ = randn_state_00;
        fft_execute(p_01);
        for (lVar6 = 0; uVar14 * 8 - lVar6 != 0; lVar6 = lVar6 + 8) {
          dVar28 = *(double *)((long)*forward_real_fft.spectrum + lVar6 * 2);
          dVar35 = *(double *)((long)*forward_real_fft.spectrum + lVar6 * 2 + 8);
          *(double *)((long)pvVar5 + lVar6) = dVar28 * dVar28 + dVar35 * dVar35;
        }
        std::__sort<double*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar5,uVar20 * 8 + 8 + (long)pvVar5)
        ;
        for (lVar6 = 1; lVar6 <= (long)uVar20; lVar6 = lVar6 + 1) {
          *(double *)((long)pvVar5 + lVar6 * 8) =
               *(double *)((long)pvVar5 + lVar6 * 8 + -8) + *(double *)((long)pvVar5 + lVar6 * 8);
        }
        dVar28 = log10(*(double *)((long)pvVar5 + (long)(int)(~uVar24 + iVar2) * 8) /
                       *(double *)((long)pvVar5 + uVar20 * 8));
        pdVar7[uVar11 + 1] = dVar28 * 10.0;
        uVar11 = uVar11 + 1;
      }
      operator_delete__(pvVar5);
      for (uVar11 = 0; uVar23 != uVar11; uVar11 = uVar11 + 1) {
        dVar35 = pdVar7[uVar11 + 1] + (dVar30 + -100.0) / 50.0;
        dVar28 = 0.0;
        if (dVar35 <= 0.0) {
          dVar28 = dVar35;
        }
        pdVar7[uVar11 + 1] = dVar28;
      }
      operator_delete__(pdVar9);
      operator_delete__(input);
      operator_delete__(input_00);
      pdVar9 = aperiodicity[uVar13];
      interp1(x_00,pdVar7,uVar18 + 2,xi,xi_length,pdVar9);
      for (uVar11 = 0; uVar19 != uVar11; uVar11 = uVar11 + 1) {
        dVar28 = pow(10.0,pdVar9[uVar11] / 20.0);
        pdVar9[uVar11] = dVar28;
      }
    }
  }
  DestroyForwardRealFFT(&forward_real_fft);
  operator_delete__(pvVar4);
  operator_delete__(x_00);
  operator_delete__(pdVar7);
  operator_delete__(y);
  operator_delete__(xi);
  return;
}

Assistant:

void D4C(const double *x, int x_length, int fs,
    const double *temporal_positions, const double *f0, int f0_length,
    int fft_size, const D4COption *option, double **aperiodicity) {
  RandnState randn_state = {};
  randn_reseed(&randn_state);

  InitializeAperiodicity(f0_length, fft_size, aperiodicity);

  int fft_size_d4c = static_cast<int>(pow(2.0, 1.0 +
    static_cast<int>(log(4.0 * fs / world::kFloorF0D4C + 1) /
      world::kLog2)));

  ForwardRealFFT forward_real_fft = {0};
  InitializeForwardRealFFT(fft_size_d4c, &forward_real_fft);

  int number_of_aperiodicities =
    static_cast<int>(MyMinDouble(world::kUpperLimit, fs / 2.0 -
      world::kFrequencyInterval) / world::kFrequencyInterval);
  // Since the window function is common in D4CGeneralBody(),
  // it is designed here to speed up.
  int window_length =
    static_cast<int>(world::kFrequencyInterval * fft_size_d4c / fs) * 2 + 1;
  double *window =  new double[window_length];
  NuttallWindow(window_length, window);

  // D4C Love Train (Aperiodicity of 0 Hz is given by the different algorithm)
  double *aperiodicity0 = new double[f0_length];
  D4CLoveTrain(x, fs, x_length, f0, f0_length, temporal_positions,
      aperiodicity0, &randn_state);

  double *coarse_aperiodicity = new double[number_of_aperiodicities + 2];
  coarse_aperiodicity[0] = -60.0;
  coarse_aperiodicity[number_of_aperiodicities + 1] =
    -world::kMySafeGuardMinimum;
  double *coarse_frequency_axis = new double[number_of_aperiodicities + 2];
  for (int i = 0; i <= number_of_aperiodicities; ++i)
    coarse_frequency_axis[i] = i * world::kFrequencyInterval;
  coarse_frequency_axis[number_of_aperiodicities + 1] = fs / 2.0;

  double *frequency_axis = new double[fft_size / 2 + 1];
  for (int i = 0; i <= fft_size / 2; ++i)
    frequency_axis[i] = static_cast<double>(i) * fs / fft_size;

  for (int i = 0; i < f0_length; ++i) {
    if (f0[i] == 0 || aperiodicity0[i] <= option->threshold) continue;
    D4CGeneralBody(x, x_length, fs, MyMaxDouble(world::kFloorF0D4C, f0[i]),
        fft_size_d4c, temporal_positions[i], number_of_aperiodicities, window,
        window_length, &forward_real_fft, &coarse_aperiodicity[1], &randn_state);

    // Linear interpolation to convert the coarse aperiodicity into its
    // spectral representation.
    GetAperiodicity(coarse_frequency_axis, coarse_aperiodicity,
        number_of_aperiodicities, frequency_axis, fft_size, aperiodicity[i]);
  }

  DestroyForwardRealFFT(&forward_real_fft);
  delete[] aperiodicity0;
  delete[] coarse_frequency_axis;
  delete[] coarse_aperiodicity;
  delete[] window;
  delete[] frequency_axis;
}